

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

int hash_block_size_to_index(int block_size)

{
  int block_size_local;
  undefined4 local_4;
  
  if (block_size == 4) {
    local_4 = 0;
  }
  else if (block_size == 8) {
    local_4 = 1;
  }
  else if (block_size == 0x10) {
    local_4 = 2;
  }
  else if (block_size == 0x20) {
    local_4 = 3;
  }
  else if (block_size == 0x40) {
    local_4 = 4;
  }
  else if (block_size == 0x80) {
    local_4 = 5;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int hash_block_size_to_index(int block_size) {
  switch (block_size) {
    case 4: return 0;
    case 8: return 1;
    case 16: return 2;
    case 32: return 3;
    case 64: return 4;
    case 128: return 5;
    default: return -1;
  }
}